

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<long> __thiscall
anon_unknown.dwarf_33386e4::MultiADescriptor::ScriptSize(MultiADescriptor *this)

{
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  optional<long> oVar1;
  size_type n_keys;
  CScript *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  _Storage<long,_true> local_38;
  undefined1 local_30;
  int local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::size((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          *)in_stack_ffffffffffffff68);
  BuildScript<int_const&>(local_28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::optional<long>::optional<unsigned_long,_true>
            ((optional<long> *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  CScript::~CScript(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_30;
    oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_38._M_value;
    return (optional<long>)
           oVar1.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override {
        const auto n_keys = m_pubkey_args.size();
        return (1 + 32 + 1) * n_keys + BuildScript(m_threshold).size() + 1;
    }